

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O2

void cleanup_ghost(void)

{
  ghost **ppgVar1;
  ghost_level *pgVar2;
  
  ppgVar1 = &ghosts;
  while (ppgVar1 = &((ghost *)ppgVar1)->next->next, (ghost *)ppgVar1 != (ghost *)0x0) {
    pgVar2 = (ghost_level *)&((ghost *)ppgVar1)->level;
    while (pgVar2 = pgVar2->next, pgVar2 != (ghost_level *)0x0) {
      if (pgVar2->blow_effect1 != (char *)0x0) {
        string_free(pgVar2->blow_effect1);
      }
      if (pgVar2->blow_effect2 != (char *)0x0) {
        string_free(pgVar2->blow_effect2);
      }
    }
    string_free(((ghost *)ppgVar1)->name);
  }
  mem_free(ghosts);
  return;
}

Assistant:

static void cleanup_ghost(void)
{
	struct ghost *g;
	for (g = ghosts; g; g = g->next) {
		struct ghost_level *l;
		for (l = g->level; l; l = l->next) {
			if (l->blow_effect1) string_free(l->blow_effect1);
			if (l->blow_effect2) string_free(l->blow_effect2);
		}
		string_free(g->name);
	}
	mem_free(ghosts);
}